

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void absl::debugging_internal::InitState(State *state,char *mangled,char *out,size_t out_size)

{
  size_t out_size_local;
  char *out_local;
  char *mangled_local;
  State *state_local;
  
  state->mangled_begin = mangled;
  state->out = out;
  state->out_end_idx = (int)out_size;
  state->recursion_depth = 0;
  state->steps = 0;
  (state->parse_state).mangled_idx = 0;
  (state->parse_state).out_cur_idx = 0;
  (state->parse_state).prev_name_idx = 0;
  *(uint *)&(state->parse_state).field_0xc = *(uint *)&(state->parse_state).field_0xc & 0xffff0000;
  *(uint *)&(state->parse_state).field_0xc =
       *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | 0x7fff0000;
  *(uint *)&(state->parse_state).field_0xc =
       *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | 0x80000000;
  return;
}

Assistant:

static void InitState(State* state,
                      const char* mangled,
                      char* out,
                      size_t out_size) {
  state->mangled_begin = mangled;
  state->out = out;
  state->out_end_idx = static_cast<int>(out_size);
  state->recursion_depth = 0;
  state->steps = 0;
#ifdef ABSL_INTERNAL_DEMANGLE_RECORDS_HIGH_WATER_MARK
  state->high_water_mark = 0;
  state->too_complex = false;
#endif

  state->parse_state.mangled_idx = 0;
  state->parse_state.out_cur_idx = 0;
  state->parse_state.prev_name_idx = 0;
  state->parse_state.prev_name_length = 0;
  state->parse_state.nest_level = -1;
  state->parse_state.append = true;
}